

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_replace(lyd_node *orig,lyd_node *repl,int destroy)

{
  lyd_node *local_30;
  lyd_node *last;
  lyd_node *iter;
  int destroy_local;
  lyd_node *repl_local;
  lyd_node *orig_local;
  
  if (repl != (lyd_node *)0x0) {
    local_30 = repl;
    if ((repl->parent == (lyd_node *)0x0) && (repl->prev->next == (lyd_node *)0x0)) {
      for (; local_30->next != (lyd_node *)0x0; local_30 = local_30->next) {
        local_30->parent = orig->parent;
      }
    }
    else {
      repl->next = (lyd_node *)0x0;
      repl->prev = repl;
    }
    if (orig->parent != (lyd_node *)0x0) {
      if (orig->parent->child == orig) {
        orig->parent->child = repl;
      }
      orig->parent = (lyd_node *)0x0;
    }
    if (orig->prev != orig) {
      if (orig->prev->next != (lyd_node *)0x0) {
        orig->prev->next = repl;
      }
      repl->prev = orig->prev;
      orig->prev = orig;
      if (orig->next == (lyd_node *)0x0) {
        last = repl;
        if (repl->parent == (lyd_node *)0x0) {
          for (; last->prev != orig; last = last->prev) {
          }
          last->prev = local_30;
        }
        else {
          repl->parent->child->prev = local_30;
        }
      }
      else {
        orig->next->prev = local_30;
        local_30->next = orig->next;
        orig->next = (lyd_node *)0x0;
      }
    }
  }
  if (destroy != 0) {
    lyd_free(orig);
  }
  return;
}

Assistant:

static void
lyd_replace(struct lyd_node *orig, struct lyd_node *repl, int destroy)
{
    struct lyd_node *iter, *last;

    if (!repl) {
        /* remove the old one */
        goto finish;
    }

    if (repl->parent || repl->prev->next) {
        /* isolate the new node */
        repl->next = NULL;
        repl->prev = repl;
        last = repl;
    } else {
        /* get the last node of a possible list of nodes to be inserted */
        for(last = repl; last->next; last = last->next) {
            /* part of the parent changes */
            last->parent = orig->parent;
        }
    }

    /* parent */
    if (orig->parent) {
        if (orig->parent->child == orig) {
            orig->parent->child = repl;
        }
        orig->parent = NULL;
    }

    /* predecessor */
    if (orig->prev == orig) {
        /* the old was alone */
        goto finish;
    }
    if (orig->prev->next) {
        orig->prev->next = repl;
    }
    repl->prev = orig->prev;
    orig->prev = orig;

    /* successor */
    if (orig->next) {
        orig->next->prev = last;
        last->next = orig->next;
        orig->next = NULL;
    } else {
        /* fix the last pointer */
        if (repl->parent) {
            repl->parent->child->prev = last;
        } else {
            /* get the first sibling */
            for (iter = repl; iter->prev != orig; iter = iter->prev);
            iter->prev = last;
        }
    }

finish:
    /* remove the old one */
    if (destroy) {
        lyd_free(orig);
    }
}